

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.cc
# Opt level: O0

void time_main<trng::lcg64_count_shift>(lcg64_count_shift *r,string *name)

{
  ulong uVar1;
  lcg64_count_shift *r_00;
  string *in_RSI;
  double dVar2;
  double res_canonical;
  double res_oo;
  double res_oc;
  double res_co;
  double res_cc;
  result_type res_plain;
  stringstream s;
  lcg64_count_shift *in_stack_fffffffffffffe50;
  stringstream local_198 [16];
  ostream local_188 [392];
  
  std::__cxx11::stringstream::stringstream(local_198);
  while( true ) {
    uVar1 = std::__cxx11::string::length();
    if (0x1f < uVar1) break;
    std::__cxx11::string::operator+=(in_RSI,' ');
  }
  std::operator<<((ostream *)&std::cout,in_RSI);
  r_00 = (lcg64_count_shift *)time_plain<trng::lcg64_count_shift>(in_stack_fffffffffffffe50);
  std::ostream::operator<<(local_188,(ulong)r_00);
  dVar2 = time_cc<trng::lcg64_count_shift>(r_00);
  std::ostream::operator<<(local_188,dVar2);
  dVar2 = time_co<trng::lcg64_count_shift>(r_00);
  std::ostream::operator<<(local_188,dVar2);
  dVar2 = time_oc<trng::lcg64_count_shift>(r_00);
  std::ostream::operator<<(local_188,dVar2);
  dVar2 = time_oo<trng::lcg64_count_shift>(r_00);
  std::ostream::operator<<(local_188,dVar2);
  dVar2 = time_canonical<trng::lcg64_count_shift,double>(r_00);
  std::ostream::operator<<(local_188,dVar2);
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void time_main(R &r, std::string name) {
  std::stringstream s;  // write data to stream to prevent that code gets optimized away
  while (name.length() < 32)
    name += ' ';
  std::cout << name;
  const auto res_plain = time_plain(r);
  s << res_plain;
  const auto res_cc = time_cc(r);
  s << res_cc;
  const auto res_co = time_co(r);
  s << res_co;
  const auto res_oc = time_oc(r);
  s << res_oc;
  const auto res_oo = time_oo(r);
  s << res_oo;
  const auto res_canonical = time_canonical<R, double>(r);
  s << res_canonical;
  std::cout << std::endl;
}